

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeNode * rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur,int *pRC)

{
  int iVar1;
  int iVar2;
  RtreeNode **in_RSI;
  RtreeNode *in_RDI;
  i64 unaff_retaddr;
  Rtree *in_stack_00000008;
  int ii;
  sqlite3_int64 id;
  
  iVar1 = 1 - (uint)*(byte *)((long)&in_RDI->iNode + 1);
  if ((&in_RDI[2].pParent)[iVar1] == (RtreeNode *)0x0) {
    iVar2 = nodeAcquire(in_stack_00000008,unaff_retaddr,in_RDI,in_RSI);
    *(int *)in_RSI = iVar2;
  }
  return (&in_RDI[2].pParent)[iVar1];
}

Assistant:

static RtreeNode *rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur, int *pRC){
  sqlite3_int64 id;
  int ii = 1 - pCur->bPoint;
  assert( ii==0 || ii==1 );
  assert( pCur->bPoint || pCur->nPoint );
  if( pCur->aNode[ii]==0 ){
    assert( pRC!=0 );
    id = ii ? pCur->aPoint[0].id : pCur->sPoint.id;
    *pRC = nodeAcquire(RTREE_OF_CURSOR(pCur), id, 0, &pCur->aNode[ii]);
  }
  return pCur->aNode[ii];
}